

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

void sig_child_handler(void)

{
  int iVar1;
  uint local_10;
  int l;
  int pid;
  
  if (verbose != 0) {
    strerr_warn("svlogd: info: ","sigchild received.",(char *)0x0,(char *)0x0,(char *)0x0,
                (char *)0x0,(strerr *)0x0);
  }
  do {
    iVar1 = wait_nohang(&wstat);
    if (iVar1 < 1) {
      return;
    }
    for (local_10 = 0; local_10 < dirn; local_10 = local_10 + 1) {
      if (dir[(int)local_10].ppid == iVar1) {
        dir[(int)local_10].ppid = 0;
        processorstop(dir + (int)local_10);
        break;
      }
    }
  } while( true );
}

Assistant:

void sig_child_handler(void) {
  int pid, l;

  if (verbose) strerr_warn2(INFO, "sigchild received.", 0);
  while ((pid =wait_nohang(&wstat)) > 0)
    for (l =0; l < dirn; ++l)
      if (dir[l].ppid == pid) {
        dir[l].ppid =0;
        processorstop(&dir[l]);
        break;
      }
}